

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

tests * lest::make_tests<lest::test[2]>(tests *__return_storage_ptr__,test (*c) [2])

{
  test *first;
  test *last;
  test (*c_local) [2];
  
  first = test_begin<lest::test[2]>(c);
  last = test_end<lest::test[2]>(c);
  make_tests(__return_storage_ptr__,first,last);
  return __return_storage_ptr__;
}

Assistant:

tests make_tests( C const & c ) { return make_tests( test_begin( c ), test_end( c ) ); }